

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O1

void __thiscall Barrier::decreaseBarrier(Barrier *this)

{
  int iVar1;
  runtime_error *this_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->barrierMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->activitiesNumber).super___atomic_base<int>._M_i != 0) {
    LOCK();
    (this->activitiesNumber).super___atomic_base<int>._M_i =
         (this->activitiesNumber).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((this->activitiesNumber).super___atomic_base<int>._M_i == 0) {
      std::condition_variable::notify_all();
    }
    else {
      iVar1 = (this->activitiesNumber).super___atomic_base<int>._M_i;
      while (iVar1 != 0) {
        std::condition_variable::wait((unique_lock *)&this->barrierCV);
        iVar1 = (this->activitiesNumber).super___atomic_base<int>._M_i;
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Barrier aleady opened!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Barrier::decreaseBarrier () {
	std::unique_lock<std::mutex> lock (barrierMutex);

	if (activitiesNumber == 0)
		throw std::runtime_error ("Barrier aleady opened!");
	
	if (--activitiesNumber == 0)
		barrierCV.notify_all ();
	else
		barrierCV.wait (lock, [&] {return activitiesNumber == 0;});
}